

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::ExceptionOr<kj::Own<kj::NetworkAddress>_>::~ExceptionOr
          (ExceptionOr<kj::Own<kj::NetworkAddress>_> *this)

{
  NetworkAddress *pNVar1;
  Disposer *pDVar2;
  
  pNVar1 = (this->value).ptr.ptr;
  if (pNVar1 != (NetworkAddress *)0x0) {
    (this->value).ptr.ptr = (NetworkAddress *)0x0;
    pDVar2 = (this->value).ptr.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,pNVar1->_vptr_NetworkAddress[-2] + (long)&pNVar1->_vptr_NetworkAddress);
  }
  if ((this->super_ExceptionOrValue).exception.ptr.isSet == true) {
    Exception::~Exception(&(this->super_ExceptionOrValue).exception.ptr.field_1.value);
    return;
  }
  return;
}

Assistant:

ExceptionOr() = default;